

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  ushort uVar44;
  undefined1 auVar45 [15];
  ushort uVar46;
  undefined1 auVar47 [15];
  ushort uVar48;
  undefined1 auVar49 [15];
  ushort uVar50;
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  unkuint9 Var73;
  undefined1 auVar74 [11];
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [11];
  undefined1 auVar78 [15];
  unkuint9 Var79;
  undefined1 auVar80 [11];
  undefined1 auVar81 [15];
  unkuint9 Var82;
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  int iVar92;
  undefined1 (*pauVar93) [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar106 [16];
  undefined1 auVar114 [16];
  undefined1 auVar122 [16];
  short sVar130;
  undefined4 uVar131;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  short sVar135;
  short sVar141;
  undefined1 auVar134 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  short sVar167;
  short sVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  short sVar193;
  short sVar195;
  short sVar196;
  short sVar197;
  short sVar198;
  short sVar199;
  short sVar200;
  undefined1 auVar194 [16];
  short sVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  byte bVar102;
  byte bVar103;
  byte bVar104;
  byte bVar105;
  byte bVar107;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar115;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar123;
  byte bVar124;
  byte bVar125;
  byte bVar126;
  byte bVar127;
  byte bVar128;
  byte bVar129;
  short sVar147;
  short sVar158;
  short sVar166;
  short sVar177;
  
  auVar132 = *(undefined1 (*) [16])above;
  auVar133 = *(undefined1 (*) [16])(above + 0x10);
  auVar188 = *(undefined1 (*) [16])(above + 0x20);
  auVar95 = *(undefined1 (*) [16])(above + 0x30);
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar132._0_13_;
  auVar40[0xe] = auVar132[7];
  uVar44 = auVar40._13_2_;
  auVar45[0xc] = auVar132[6];
  auVar45._0_12_ = auVar132._0_12_;
  auVar45._13_2_ = uVar44;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar132._0_11_;
  auVar52._12_3_ = auVar45._12_3_;
  auVar56[10] = auVar132[5];
  auVar56._0_10_ = auVar132._0_10_;
  auVar56._11_4_ = auVar52._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar132._0_9_;
  auVar60._10_5_ = auVar56._10_5_;
  auVar64[8] = auVar132[4];
  auVar64._0_8_ = auVar132._0_8_;
  auVar64._9_6_ = auVar60._9_6_;
  auVar72._7_8_ = 0;
  auVar72._0_7_ = auVar64._8_7_;
  Var73 = CONCAT81(SUB158(auVar72 << 0x40,7),auVar132[3]);
  auVar84._9_6_ = 0;
  auVar84._0_9_ = Var73;
  auVar74._1_10_ = SUB1510(auVar84 << 0x30,5);
  auVar74[0] = auVar132[2];
  auVar85._11_4_ = 0;
  auVar85._0_11_ = auVar74;
  auVar68[2] = auVar132[1];
  auVar68._0_2_ = auVar132._0_2_;
  auVar68._3_12_ = SUB1512(auVar85 << 0x20,3);
  auVar142._0_2_ = auVar132._0_2_ & 0xff;
  auVar142._2_13_ = auVar68._2_13_;
  auVar142[0xf] = 0;
  auVar94._0_2_ = CONCAT11(0,auVar132[8]);
  bVar99 = auVar132[9];
  auVar94[2] = bVar99;
  auVar94[3] = 0;
  bVar100 = auVar132[10];
  auVar94[4] = bVar100;
  auVar94[5] = 0;
  bVar101 = auVar132[0xb];
  auVar94[6] = bVar101;
  auVar94[7] = 0;
  bVar102 = auVar132[0xc];
  auVar94[8] = bVar102;
  auVar94[9] = 0;
  bVar103 = auVar132[0xd];
  auVar94[10] = bVar103;
  auVar94[0xb] = 0;
  bVar104 = auVar132[0xe];
  auVar94[0xc] = bVar104;
  auVar94[0xd] = 0;
  bVar105 = auVar132[0xf];
  auVar94[0xe] = bVar105;
  auVar94[0xf] = 0;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar133._0_13_;
  auVar41[0xe] = auVar133[7];
  uVar46 = auVar41._13_2_;
  auVar47[0xc] = auVar133[6];
  auVar47._0_12_ = auVar133._0_12_;
  auVar47._13_2_ = uVar46;
  auVar53[0xb] = 0;
  auVar53._0_11_ = auVar133._0_11_;
  auVar53._12_3_ = auVar47._12_3_;
  auVar57[10] = auVar133[5];
  auVar57._0_10_ = auVar133._0_10_;
  auVar57._11_4_ = auVar53._11_4_;
  auVar61[9] = 0;
  auVar61._0_9_ = auVar133._0_9_;
  auVar61._10_5_ = auVar57._10_5_;
  auVar65[8] = auVar133[4];
  auVar65._0_8_ = auVar133._0_8_;
  auVar65._9_6_ = auVar61._9_6_;
  auVar75._7_8_ = 0;
  auVar75._0_7_ = auVar65._8_7_;
  Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),auVar133[3]);
  auVar86._9_6_ = 0;
  auVar86._0_9_ = Var76;
  auVar77._1_10_ = SUB1510(auVar86 << 0x30,5);
  auVar77[0] = auVar133[2];
  auVar87._11_4_ = 0;
  auVar87._0_11_ = auVar77;
  auVar69[2] = auVar133[1];
  auVar69._0_2_ = auVar133._0_2_;
  auVar69._3_12_ = SUB1512(auVar87 << 0x20,3);
  auVar148._0_2_ = auVar133._0_2_ & 0xff;
  auVar148._2_13_ = auVar69._2_13_;
  auVar148[0xf] = 0;
  auVar106._0_2_ = CONCAT11(0,auVar133[8]);
  bVar107 = auVar133[9];
  auVar106[2] = bVar107;
  auVar106[3] = 0;
  bVar108 = auVar133[10];
  auVar106[4] = bVar108;
  auVar106[5] = 0;
  bVar109 = auVar133[0xb];
  auVar106[6] = bVar109;
  auVar106[7] = 0;
  bVar110 = auVar133[0xc];
  auVar106[8] = bVar110;
  auVar106[9] = 0;
  bVar111 = auVar133[0xd];
  auVar106[10] = bVar111;
  auVar106[0xb] = 0;
  bVar112 = auVar133[0xe];
  auVar106[0xc] = bVar112;
  auVar106[0xd] = 0;
  bVar113 = auVar133[0xf];
  auVar106[0xe] = bVar113;
  auVar106[0xf] = 0;
  auVar42[0xd] = 0;
  auVar42._0_13_ = auVar188._0_13_;
  auVar42[0xe] = auVar188[7];
  uVar48 = auVar42._13_2_;
  auVar49[0xc] = auVar188[6];
  auVar49._0_12_ = auVar188._0_12_;
  auVar49._13_2_ = uVar48;
  auVar54[0xb] = 0;
  auVar54._0_11_ = auVar188._0_11_;
  auVar54._12_3_ = auVar49._12_3_;
  auVar58[10] = auVar188[5];
  auVar58._0_10_ = auVar188._0_10_;
  auVar58._11_4_ = auVar54._11_4_;
  auVar62[9] = 0;
  auVar62._0_9_ = auVar188._0_9_;
  auVar62._10_5_ = auVar58._10_5_;
  auVar66[8] = auVar188[4];
  auVar66._0_8_ = auVar188._0_8_;
  auVar66._9_6_ = auVar62._9_6_;
  auVar78._7_8_ = 0;
  auVar78._0_7_ = auVar66._8_7_;
  Var79 = CONCAT81(SUB158(auVar78 << 0x40,7),auVar188[3]);
  auVar88._9_6_ = 0;
  auVar88._0_9_ = Var79;
  auVar80._1_10_ = SUB1510(auVar88 << 0x30,5);
  auVar80[0] = auVar188[2];
  auVar89._11_4_ = 0;
  auVar89._0_11_ = auVar80;
  auVar70[2] = auVar188[1];
  auVar70._0_2_ = auVar188._0_2_;
  auVar70._3_12_ = SUB1512(auVar89 << 0x20,3);
  auVar159._0_2_ = auVar188._0_2_ & 0xff;
  auVar159._2_13_ = auVar70._2_13_;
  auVar159[0xf] = 0;
  auVar114._0_2_ = CONCAT11(0,auVar188[8]);
  bVar115 = auVar188[9];
  auVar114[2] = bVar115;
  auVar114[3] = 0;
  bVar116 = auVar188[10];
  auVar114[4] = bVar116;
  auVar114[5] = 0;
  bVar117 = auVar188[0xb];
  auVar114[6] = bVar117;
  auVar114[7] = 0;
  bVar118 = auVar188[0xc];
  auVar114[8] = bVar118;
  auVar114[9] = 0;
  bVar119 = auVar188[0xd];
  auVar114[10] = bVar119;
  auVar114[0xb] = 0;
  bVar120 = auVar188[0xe];
  auVar114[0xc] = bVar120;
  auVar114[0xd] = 0;
  bVar121 = auVar188[0xf];
  auVar114[0xe] = bVar121;
  auVar114[0xf] = 0;
  auVar43[0xd] = 0;
  auVar43._0_13_ = auVar95._0_13_;
  auVar43[0xe] = auVar95[7];
  uVar50 = auVar43._13_2_;
  auVar51[0xc] = auVar95[6];
  auVar51._0_12_ = auVar95._0_12_;
  auVar51._13_2_ = uVar50;
  auVar55[0xb] = 0;
  auVar55._0_11_ = auVar95._0_11_;
  auVar55._12_3_ = auVar51._12_3_;
  auVar59[10] = auVar95[5];
  auVar59._0_10_ = auVar95._0_10_;
  auVar59._11_4_ = auVar55._11_4_;
  auVar63[9] = 0;
  auVar63._0_9_ = auVar95._0_9_;
  auVar63._10_5_ = auVar59._10_5_;
  auVar67[8] = auVar95[4];
  auVar67._0_8_ = auVar95._0_8_;
  auVar67._9_6_ = auVar63._9_6_;
  auVar81._7_8_ = 0;
  auVar81._0_7_ = auVar67._8_7_;
  Var82 = CONCAT81(SUB158(auVar81 << 0x40,7),auVar95[3]);
  auVar90._9_6_ = 0;
  auVar90._0_9_ = Var82;
  auVar83._1_10_ = SUB1510(auVar90 << 0x30,5);
  auVar83[0] = auVar95[2];
  auVar91._11_4_ = 0;
  auVar91._0_11_ = auVar83;
  auVar71[2] = auVar95[1];
  auVar71._0_2_ = auVar95._0_2_;
  auVar71._3_12_ = SUB1512(auVar91 << 0x20,3);
  auVar169._0_2_ = auVar95._0_2_ & 0xff;
  auVar169._2_13_ = auVar71._2_13_;
  auVar169[0xf] = 0;
  auVar122._0_2_ = CONCAT11(0,auVar95[8]);
  bVar123 = auVar95[9];
  auVar122[2] = bVar123;
  auVar122[3] = 0;
  bVar124 = auVar95[10];
  auVar122[4] = bVar124;
  auVar122[5] = 0;
  bVar125 = auVar95[0xb];
  auVar122[6] = bVar125;
  auVar122[7] = 0;
  bVar126 = auVar95[0xc];
  auVar122[8] = bVar126;
  auVar122[9] = 0;
  bVar127 = auVar95[0xd];
  auVar122[10] = bVar127;
  auVar122[0xb] = 0;
  bVar128 = auVar95[0xe];
  auVar122[0xc] = bVar128;
  auVar122[0xd] = 0;
  bVar129 = auVar95[0xf];
  auVar122[0xe] = bVar129;
  auVar122[0xf] = 0;
  auVar132 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  uVar131 = auVar132._0_4_;
  sVar167 = auVar132._0_2_;
  sVar168 = auVar132._2_2_;
  auVar132 = *(undefined1 (*) [16])left;
  auVar143._0_2_ = auVar142._0_2_ - sVar167;
  auVar143._2_2_ = auVar68._2_2_ - sVar168;
  auVar143._4_2_ = auVar74._0_2_ - sVar167;
  sVar147 = (short)Var73;
  auVar143._6_2_ = sVar147 - sVar168;
  auVar143._8_2_ = auVar64._8_2_ - sVar167;
  auVar143._10_2_ = auVar56._10_2_ - sVar168;
  auVar143._12_2_ = auVar45._12_2_ - sVar167;
  auVar143._14_2_ = (uVar44 >> 8) - sVar168;
  auVar95 = pabsw(auVar132,auVar143);
  auVar149._0_2_ = auVar148._0_2_ - sVar167;
  auVar149._2_2_ = auVar69._2_2_ - sVar168;
  auVar149._4_2_ = auVar77._0_2_ - sVar167;
  sVar158 = (short)Var76;
  auVar149._6_2_ = sVar158 - sVar168;
  auVar149._8_2_ = auVar65._8_2_ - sVar167;
  auVar149._10_2_ = auVar57._10_2_ - sVar168;
  auVar149._12_2_ = auVar47._12_2_ - sVar167;
  auVar149._14_2_ = (uVar46 >> 8) - sVar168;
  auVar96 = pabsw(auVar95,auVar149);
  auVar160._0_2_ = auVar159._0_2_ - sVar167;
  auVar160._2_2_ = auVar70._2_2_ - sVar168;
  auVar160._4_2_ = auVar80._0_2_ - sVar167;
  sVar166 = (short)Var79;
  auVar160._6_2_ = sVar166 - sVar168;
  auVar160._8_2_ = auVar66._8_2_ - sVar167;
  auVar160._10_2_ = auVar58._10_2_ - sVar168;
  auVar160._12_2_ = auVar49._12_2_ - sVar167;
  auVar160._14_2_ = (uVar48 >> 8) - sVar168;
  auVar170._0_2_ = auVar169._0_2_ - sVar167;
  auVar170._2_2_ = auVar71._2_2_ - sVar168;
  auVar170._4_2_ = auVar83._0_2_ - sVar167;
  sVar177 = (short)Var82;
  auVar170._6_2_ = sVar177 - sVar168;
  auVar170._8_2_ = auVar67._8_2_ - sVar167;
  auVar170._10_2_ = auVar59._10_2_ - sVar168;
  auVar170._12_2_ = auVar51._12_2_ - sVar167;
  auVar170._14_2_ = (uVar50 >> 8) - sVar168;
  pauVar93 = (undefined1 (*) [16])(dst + 0x30);
  iVar92 = 0x10;
  auVar97 = pabsw(auVar96,auVar160);
  auVar98 = pabsw(auVar97,auVar170);
  auVar133 = auVar170;
  auVar188 = _DAT_004dd960;
  do {
    auVar194 = pshufb(auVar132,auVar188);
    sVar193 = auVar194._0_2_;
    sVar195 = auVar194._2_2_;
    sVar196 = auVar194._4_2_;
    sVar197 = auVar194._6_2_;
    sVar198 = auVar194._8_2_;
    sVar199 = auVar194._10_2_;
    sVar200 = auVar194._12_2_;
    sVar201 = auVar194._14_2_;
    auVar192._0_2_ = (auVar143._0_2_ + sVar193) - auVar142._0_2_;
    auVar192._2_2_ = (auVar143._2_2_ + sVar195) - auVar68._2_2_;
    auVar192._4_2_ = (auVar143._4_2_ + sVar196) - auVar74._0_2_;
    auVar192._6_2_ = (auVar143._6_2_ + sVar197) - sVar147;
    auVar192._8_2_ = (auVar143._8_2_ + sVar198) - auVar64._8_2_;
    auVar192._10_2_ = (auVar143._10_2_ + sVar199) - auVar56._10_2_;
    auVar192._12_2_ = (auVar143._12_2_ + sVar200) - auVar45._12_2_;
    auVar192._14_2_ = (auVar143._14_2_ + sVar201) - (uVar44 >> 8);
    auVar171 = pabsw(auVar133,auVar192);
    auVar180._0_2_ = (auVar143._0_2_ + sVar193) - sVar167;
    auVar180._2_2_ = (auVar143._2_2_ + sVar195) - sVar168;
    auVar180._4_2_ = (auVar143._4_2_ + sVar196) - sVar167;
    auVar180._6_2_ = (auVar143._6_2_ + sVar197) - sVar168;
    auVar180._8_2_ = (auVar143._8_2_ + sVar198) - sVar167;
    auVar180._10_2_ = (auVar143._10_2_ + sVar199) - sVar168;
    auVar180._12_2_ = (auVar143._12_2_ + sVar200) - sVar167;
    auVar180._14_2_ = (auVar143._14_2_ + sVar201) - sVar168;
    auVar133 = pabsw(auVar180,auVar180);
    local_88 = auVar95._0_2_;
    sStack_86 = auVar95._2_2_;
    sStack_84 = auVar95._4_2_;
    sStack_82 = auVar95._6_2_;
    sStack_80 = auVar95._8_2_;
    sStack_7e = auVar95._10_2_;
    sStack_7c = auVar95._12_2_;
    sStack_7a = auVar95._14_2_;
    auVar144._0_2_ = -(ushort)(auVar171._0_2_ < local_88);
    auVar144._2_2_ = -(ushort)(auVar171._2_2_ < sStack_86);
    auVar144._4_2_ = -(ushort)(auVar171._4_2_ < sStack_84);
    auVar144._6_2_ = -(ushort)(auVar171._6_2_ < sStack_82);
    auVar144._8_2_ = -(ushort)(auVar171._8_2_ < sStack_80);
    auVar144._10_2_ = -(ushort)(auVar171._10_2_ < sStack_7e);
    auVar144._12_2_ = -(ushort)(auVar171._12_2_ < sStack_7c);
    auVar144._14_2_ = -(ushort)(auVar171._14_2_ < sStack_7a);
    auVar186._0_2_ = -(ushort)(auVar133._0_2_ < local_88);
    auVar186._2_2_ = -(ushort)(auVar133._2_2_ < sStack_86);
    auVar186._4_2_ = -(ushort)(auVar133._4_2_ < sStack_84);
    auVar186._6_2_ = -(ushort)(auVar133._6_2_ < sStack_82);
    auVar186._8_2_ = -(ushort)(auVar133._8_2_ < sStack_80);
    auVar186._10_2_ = -(ushort)(auVar133._10_2_ < sStack_7e);
    auVar186._12_2_ = -(ushort)(auVar133._12_2_ < sStack_7c);
    auVar186._14_2_ = -(ushort)(auVar133._14_2_ < sStack_7a);
    auVar172._0_2_ = -(ushort)(auVar133._0_2_ < auVar171._0_2_);
    auVar172._2_2_ = -(ushort)(auVar133._2_2_ < auVar171._2_2_);
    auVar172._4_2_ = -(ushort)(auVar133._4_2_ < auVar171._4_2_);
    auVar172._6_2_ = -(ushort)(auVar133._6_2_ < auVar171._6_2_);
    auVar172._8_2_ = -(ushort)(auVar133._8_2_ < auVar171._8_2_);
    auVar172._10_2_ = -(ushort)(auVar133._10_2_ < auVar171._10_2_);
    auVar172._12_2_ = -(ushort)(auVar133._12_2_ < auVar171._12_2_);
    auVar172._14_2_ = -(ushort)(auVar133._14_2_ < auVar171._14_2_);
    auVar171._4_2_ = sVar167;
    auVar171._0_4_ = uVar131;
    auVar171._6_2_ = sVar168;
    auVar171._8_2_ = sVar167;
    auVar171._10_2_ = sVar168;
    auVar171._12_2_ = sVar167;
    auVar171._14_2_ = sVar168;
    auVar145._0_2_ = sVar193 - sVar167;
    auVar145._2_2_ = sVar195 - sVar168;
    auVar145._4_2_ = sVar196 - sVar167;
    auVar145._6_2_ = sVar197 - sVar168;
    auVar145._8_2_ = sVar198 - sVar167;
    auVar145._10_2_ = sVar199 - sVar168;
    auVar145._12_2_ = sVar200 - sVar167;
    auVar145._14_2_ = sVar201 - sVar168;
    auVar187._0_2_ = auVar94._0_2_ - sVar167;
    auVar187._2_2_ = (ushort)bVar99 - sVar168;
    auVar187._4_2_ = (ushort)bVar100 - sVar167;
    auVar187._6_2_ = (ushort)bVar101 - sVar168;
    auVar187._8_2_ = (ushort)bVar102 - sVar167;
    auVar187._10_2_ = (ushort)bVar103 - sVar168;
    auVar187._12_2_ = (ushort)bVar104 - sVar167;
    auVar187._14_2_ = (ushort)bVar105 - sVar168;
    auVar178 = pabsw(in_XMM10,auVar187);
    auVar133 = pabsw(auVar187,auVar145);
    auVar150._0_2_ = (auVar145._0_2_ + auVar94._0_2_) - sVar167;
    auVar150._2_2_ = (auVar145._2_2_ + (ushort)bVar99) - sVar168;
    auVar150._4_2_ = (auVar145._4_2_ + (ushort)bVar100) - sVar167;
    auVar150._6_2_ = (auVar145._6_2_ + (ushort)bVar101) - sVar168;
    auVar150._8_2_ = (auVar145._8_2_ + (ushort)bVar102) - sVar167;
    auVar150._10_2_ = (auVar145._10_2_ + (ushort)bVar103) - sVar168;
    auVar150._12_2_ = (auVar145._12_2_ + (ushort)bVar104) - sVar167;
    auVar150._14_2_ = (auVar145._14_2_ + (ushort)bVar105) - sVar168;
    auVar151 = pabsw(auVar150,auVar150);
    sVar130 = auVar133._0_2_;
    auVar189._0_2_ = -(ushort)(sVar130 < auVar178._0_2_);
    sVar135 = auVar133._2_2_;
    auVar189._2_2_ = -(ushort)(sVar135 < auVar178._2_2_);
    sVar136 = auVar133._4_2_;
    auVar189._4_2_ = -(ushort)(sVar136 < auVar178._4_2_);
    sVar137 = auVar133._6_2_;
    auVar189._6_2_ = -(ushort)(sVar137 < auVar178._6_2_);
    sVar138 = auVar133._8_2_;
    auVar189._8_2_ = -(ushort)(sVar138 < auVar178._8_2_);
    sVar139 = auVar133._10_2_;
    auVar189._10_2_ = -(ushort)(sVar139 < auVar178._10_2_);
    sVar140 = auVar133._12_2_;
    auVar189._12_2_ = -(ushort)(sVar140 < auVar178._12_2_);
    sVar141 = auVar133._14_2_;
    auVar189._14_2_ = -(ushort)(sVar141 < auVar178._14_2_);
    auVar179._0_2_ = -(ushort)(auVar151._0_2_ < auVar178._0_2_);
    auVar179._2_2_ = -(ushort)(auVar151._2_2_ < auVar178._2_2_);
    auVar179._4_2_ = -(ushort)(auVar151._4_2_ < auVar178._4_2_);
    auVar179._6_2_ = -(ushort)(auVar151._6_2_ < auVar178._6_2_);
    auVar179._8_2_ = -(ushort)(auVar151._8_2_ < auVar178._8_2_);
    auVar179._10_2_ = -(ushort)(auVar151._10_2_ < auVar178._10_2_);
    auVar179._12_2_ = -(ushort)(auVar151._12_2_ < auVar178._12_2_);
    auVar179._14_2_ = -(ushort)(auVar151._14_2_ < auVar178._14_2_);
    auVar190._0_2_ = -(ushort)(auVar151._0_2_ < sVar130);
    auVar190._2_2_ = -(ushort)(auVar151._2_2_ < sVar135);
    auVar190._4_2_ = -(ushort)(auVar151._4_2_ < sVar136);
    auVar190._6_2_ = -(ushort)(auVar151._6_2_ < sVar137);
    auVar190._8_2_ = -(ushort)(auVar151._8_2_ < sVar138);
    auVar190._10_2_ = -(ushort)(auVar151._10_2_ < sVar139);
    auVar190._12_2_ = -(ushort)(auVar151._12_2_ < sVar140);
    auVar190._14_2_ = -(ushort)(auVar151._14_2_ < sVar141);
    auVar151._4_2_ = sVar167;
    auVar151._0_4_ = uVar131;
    auVar151._6_2_ = sVar168;
    auVar151._8_2_ = sVar167;
    auVar151._10_2_ = sVar168;
    auVar151._12_2_ = sVar167;
    auVar151._14_2_ = sVar168;
    auVar187 = ~(auVar186 | auVar144) & auVar194 |
               (~auVar172 & auVar142 | auVar171 & auVar172) & (auVar186 | auVar144);
    auVar180 = ~(auVar179 | auVar189) & auVar194 |
               (~auVar190 & auVar94 | auVar151 & auVar190) & (auVar179 | auVar189);
    sVar1 = auVar187._0_2_;
    sVar4 = auVar187._2_2_;
    sVar7 = auVar187._4_2_;
    sVar9 = auVar187._6_2_;
    sVar11 = auVar187._8_2_;
    sVar13 = auVar187._10_2_;
    sVar15 = auVar187._12_2_;
    sVar17 = auVar187._14_2_;
    sVar19 = auVar180._0_2_;
    sVar21 = auVar180._2_2_;
    sVar23 = auVar180._4_2_;
    sVar25 = auVar180._6_2_;
    sVar27 = auVar180._8_2_;
    sVar29 = auVar180._10_2_;
    sVar31 = auVar180._12_2_;
    sVar33 = auVar180._14_2_;
    auVar173._0_2_ = (auVar149._0_2_ + sVar193) - auVar148._0_2_;
    auVar173._2_2_ = (auVar149._2_2_ + sVar195) - auVar69._2_2_;
    auVar173._4_2_ = (auVar149._4_2_ + sVar196) - auVar77._0_2_;
    auVar173._6_2_ = (auVar149._6_2_ + sVar197) - sVar158;
    auVar173._8_2_ = (auVar149._8_2_ + sVar198) - auVar65._8_2_;
    auVar173._10_2_ = (auVar149._10_2_ + sVar199) - auVar57._10_2_;
    auVar173._12_2_ = (auVar149._12_2_ + sVar200) - auVar47._12_2_;
    auVar173._14_2_ = (auVar149._14_2_ + sVar201) - (uVar46 >> 8);
    auVar171 = pabsw(auVar173,auVar173);
    auVar152._0_2_ = (auVar149._0_2_ + sVar193) - sVar167;
    auVar152._2_2_ = (auVar149._2_2_ + sVar195) - sVar168;
    auVar152._4_2_ = (auVar149._4_2_ + sVar196) - sVar167;
    auVar152._6_2_ = (auVar149._6_2_ + sVar197) - sVar168;
    auVar152._8_2_ = (auVar149._8_2_ + sVar198) - sVar167;
    auVar152._10_2_ = (auVar149._10_2_ + sVar199) - sVar168;
    auVar152._12_2_ = (auVar149._12_2_ + sVar200) - sVar167;
    auVar152._14_2_ = (auVar149._14_2_ + sVar201) - sVar168;
    auVar133 = pabsw(auVar152,auVar152);
    local_a8 = auVar96._0_2_;
    sStack_a6 = auVar96._2_2_;
    sStack_a4 = auVar96._4_2_;
    sStack_a2 = auVar96._6_2_;
    sStack_a0 = auVar96._8_2_;
    sStack_9e = auVar96._10_2_;
    sStack_9c = auVar96._12_2_;
    sStack_9a = auVar96._14_2_;
    auVar181._0_2_ = -(ushort)(auVar171._0_2_ < local_a8);
    auVar181._2_2_ = -(ushort)(auVar171._2_2_ < sStack_a6);
    auVar181._4_2_ = -(ushort)(auVar171._4_2_ < sStack_a4);
    auVar181._6_2_ = -(ushort)(auVar171._6_2_ < sStack_a2);
    auVar181._8_2_ = -(ushort)(auVar171._8_2_ < sStack_a0);
    auVar181._10_2_ = -(ushort)(auVar171._10_2_ < sStack_9e);
    auVar181._12_2_ = -(ushort)(auVar171._12_2_ < sStack_9c);
    auVar181._14_2_ = -(ushort)(auVar171._14_2_ < sStack_9a);
    auVar191._0_2_ = -(ushort)(auVar133._0_2_ < local_a8);
    auVar191._2_2_ = -(ushort)(auVar133._2_2_ < sStack_a6);
    auVar191._4_2_ = -(ushort)(auVar133._4_2_ < sStack_a4);
    auVar191._6_2_ = -(ushort)(auVar133._6_2_ < sStack_a2);
    auVar191._8_2_ = -(ushort)(auVar133._8_2_ < sStack_a0);
    auVar191._10_2_ = -(ushort)(auVar133._10_2_ < sStack_9e);
    auVar191._12_2_ = -(ushort)(auVar133._12_2_ < sStack_9c);
    auVar191._14_2_ = -(ushort)(auVar133._14_2_ < sStack_9a);
    auVar174._0_2_ = -(ushort)(auVar133._0_2_ < auVar171._0_2_);
    auVar174._2_2_ = -(ushort)(auVar133._2_2_ < auVar171._2_2_);
    auVar174._4_2_ = -(ushort)(auVar133._4_2_ < auVar171._4_2_);
    auVar174._6_2_ = -(ushort)(auVar133._6_2_ < auVar171._6_2_);
    auVar174._8_2_ = -(ushort)(auVar133._8_2_ < auVar171._8_2_);
    auVar174._10_2_ = -(ushort)(auVar133._10_2_ < auVar171._10_2_);
    auVar174._12_2_ = -(ushort)(auVar133._12_2_ < auVar171._12_2_);
    auVar174._14_2_ = -(ushort)(auVar133._14_2_ < auVar171._14_2_);
    auVar178._4_2_ = sVar167;
    auVar178._0_4_ = uVar131;
    auVar178._6_2_ = sVar168;
    auVar178._8_2_ = sVar167;
    auVar178._10_2_ = sVar168;
    auVar178._12_2_ = sVar167;
    auVar178._14_2_ = sVar168;
    auVar182._0_2_ = auVar106._0_2_ - sVar167;
    auVar182._2_2_ = (ushort)bVar107 - sVar168;
    auVar182._4_2_ = (ushort)bVar108 - sVar167;
    auVar182._6_2_ = (ushort)bVar109 - sVar168;
    auVar182._8_2_ = (ushort)bVar110 - sVar167;
    auVar182._10_2_ = (ushort)bVar111 - sVar168;
    auVar182._12_2_ = (ushort)bVar112 - sVar167;
    auVar182._14_2_ = (ushort)bVar113 - sVar168;
    auVar171 = pabsw(auVar182,auVar182);
    auVar153._0_2_ = (auVar145._0_2_ + auVar106._0_2_) - sVar167;
    auVar153._2_2_ = (auVar145._2_2_ + (ushort)bVar107) - sVar168;
    auVar153._4_2_ = (auVar145._4_2_ + (ushort)bVar108) - sVar167;
    auVar153._6_2_ = (auVar145._6_2_ + (ushort)bVar109) - sVar168;
    auVar153._8_2_ = (auVar145._8_2_ + (ushort)bVar110) - sVar167;
    auVar153._10_2_ = (auVar145._10_2_ + (ushort)bVar111) - sVar168;
    auVar153._12_2_ = (auVar145._12_2_ + (ushort)bVar112) - sVar167;
    auVar153._14_2_ = (auVar145._14_2_ + (ushort)bVar113) - sVar168;
    auVar133 = pabsw(auVar153,auVar153);
    auVar202._0_2_ = -(ushort)(sVar130 < auVar171._0_2_);
    auVar202._2_2_ = -(ushort)(sVar135 < auVar171._2_2_);
    auVar202._4_2_ = -(ushort)(sVar136 < auVar171._4_2_);
    auVar202._6_2_ = -(ushort)(sVar137 < auVar171._6_2_);
    auVar202._8_2_ = -(ushort)(sVar138 < auVar171._8_2_);
    auVar202._10_2_ = -(ushort)(sVar139 < auVar171._10_2_);
    auVar202._12_2_ = -(ushort)(sVar140 < auVar171._12_2_);
    auVar202._14_2_ = -(ushort)(sVar141 < auVar171._14_2_);
    auVar183._0_2_ = -(ushort)(auVar133._0_2_ < auVar171._0_2_);
    auVar183._2_2_ = -(ushort)(auVar133._2_2_ < auVar171._2_2_);
    auVar183._4_2_ = -(ushort)(auVar133._4_2_ < auVar171._4_2_);
    auVar183._6_2_ = -(ushort)(auVar133._6_2_ < auVar171._6_2_);
    auVar183._8_2_ = -(ushort)(auVar133._8_2_ < auVar171._8_2_);
    auVar183._10_2_ = -(ushort)(auVar133._10_2_ < auVar171._10_2_);
    auVar183._12_2_ = -(ushort)(auVar133._12_2_ < auVar171._12_2_);
    auVar183._14_2_ = -(ushort)(auVar133._14_2_ < auVar171._14_2_);
    auVar203._0_2_ = -(ushort)(auVar133._0_2_ < sVar130);
    auVar203._2_2_ = -(ushort)(auVar133._2_2_ < sVar135);
    auVar203._4_2_ = -(ushort)(auVar133._4_2_ < sVar136);
    auVar203._6_2_ = -(ushort)(auVar133._6_2_ < sVar137);
    auVar203._8_2_ = -(ushort)(auVar133._8_2_ < sVar138);
    auVar203._10_2_ = -(ushort)(auVar133._10_2_ < sVar139);
    auVar203._12_2_ = -(ushort)(auVar133._12_2_ < sVar140);
    auVar203._14_2_ = -(ushort)(auVar133._14_2_ < sVar141);
    auVar35._4_2_ = sVar167;
    auVar35._0_4_ = uVar131;
    auVar35._6_2_ = sVar168;
    auVar35._8_2_ = sVar167;
    auVar35._10_2_ = sVar168;
    auVar35._12_2_ = sVar167;
    auVar35._14_2_ = sVar168;
    auVar192 = ~(auVar191 | auVar181) & auVar194 |
               (~auVar174 & auVar148 | auVar178 & auVar174) & (auVar191 | auVar181);
    auVar178 = ~(auVar183 | auVar202) & auVar194 |
               (~auVar203 & auVar106 | auVar35 & auVar203) & (auVar183 | auVar202);
    sVar2 = auVar192._0_2_;
    sVar5 = auVar192._2_2_;
    sVar8 = auVar192._4_2_;
    sVar10 = auVar192._6_2_;
    sVar12 = auVar192._8_2_;
    sVar14 = auVar192._10_2_;
    sVar16 = auVar192._12_2_;
    sVar18 = auVar192._14_2_;
    sVar20 = auVar178._0_2_;
    sVar22 = auVar178._2_2_;
    sVar24 = auVar178._4_2_;
    sVar26 = auVar178._6_2_;
    sVar28 = auVar178._8_2_;
    sVar30 = auVar178._10_2_;
    sVar32 = auVar178._12_2_;
    sVar34 = auVar178._14_2_;
    auVar175._0_2_ = (auVar160._0_2_ + sVar193) - auVar159._0_2_;
    auVar175._2_2_ = (auVar160._2_2_ + sVar195) - auVar70._2_2_;
    auVar175._4_2_ = (auVar160._4_2_ + sVar196) - auVar80._0_2_;
    auVar175._6_2_ = (auVar160._6_2_ + sVar197) - sVar166;
    auVar175._8_2_ = (auVar160._8_2_ + sVar198) - auVar66._8_2_;
    auVar175._10_2_ = (auVar160._10_2_ + sVar199) - auVar58._10_2_;
    auVar175._12_2_ = (auVar160._12_2_ + sVar200) - auVar49._12_2_;
    auVar175._14_2_ = (auVar160._14_2_ + sVar201) - (uVar48 >> 8);
    auVar171 = pabsw(auVar178,auVar175);
    auVar154._0_2_ = (auVar160._0_2_ + sVar193) - sVar167;
    auVar154._2_2_ = (auVar160._2_2_ + sVar195) - sVar168;
    auVar154._4_2_ = (auVar160._4_2_ + sVar196) - sVar167;
    auVar154._6_2_ = (auVar160._6_2_ + sVar197) - sVar168;
    auVar154._8_2_ = (auVar160._8_2_ + sVar198) - sVar167;
    auVar154._10_2_ = (auVar160._10_2_ + sVar199) - sVar168;
    auVar154._12_2_ = (auVar160._12_2_ + sVar200) - sVar167;
    auVar154._14_2_ = (auVar160._14_2_ + sVar201) - sVar168;
    auVar133 = pabsw(auVar154,auVar154);
    local_d8 = auVar97._0_2_;
    sStack_d6 = auVar97._2_2_;
    sStack_d4 = auVar97._4_2_;
    sStack_d2 = auVar97._6_2_;
    sStack_d0 = auVar97._8_2_;
    sStack_ce = auVar97._10_2_;
    sStack_cc = auVar97._12_2_;
    sStack_ca = auVar97._14_2_;
    auVar204._0_2_ = -(ushort)(auVar171._0_2_ < local_d8);
    auVar204._2_2_ = -(ushort)(auVar171._2_2_ < sStack_d6);
    auVar204._4_2_ = -(ushort)(auVar171._4_2_ < sStack_d4);
    auVar204._6_2_ = -(ushort)(auVar171._6_2_ < sStack_d2);
    auVar204._8_2_ = -(ushort)(auVar171._8_2_ < sStack_d0);
    auVar204._10_2_ = -(ushort)(auVar171._10_2_ < sStack_ce);
    auVar204._12_2_ = -(ushort)(auVar171._12_2_ < sStack_cc);
    auVar204._14_2_ = -(ushort)(auVar171._14_2_ < sStack_ca);
    auVar176._0_2_ = -(ushort)(auVar133._0_2_ < local_d8);
    auVar176._2_2_ = -(ushort)(auVar133._2_2_ < sStack_d6);
    auVar176._4_2_ = -(ushort)(auVar133._4_2_ < sStack_d4);
    auVar176._6_2_ = -(ushort)(auVar133._6_2_ < sStack_d2);
    auVar176._8_2_ = -(ushort)(auVar133._8_2_ < sStack_d0);
    auVar176._10_2_ = -(ushort)(auVar133._10_2_ < sStack_ce);
    auVar176._12_2_ = -(ushort)(auVar133._12_2_ < sStack_cc);
    auVar176._14_2_ = -(ushort)(auVar133._14_2_ < sStack_ca);
    auVar184._0_2_ = -(ushort)(auVar133._0_2_ < auVar171._0_2_);
    auVar184._2_2_ = -(ushort)(auVar133._2_2_ < auVar171._2_2_);
    auVar184._4_2_ = -(ushort)(auVar133._4_2_ < auVar171._4_2_);
    auVar184._6_2_ = -(ushort)(auVar133._6_2_ < auVar171._6_2_);
    auVar184._8_2_ = -(ushort)(auVar133._8_2_ < auVar171._8_2_);
    auVar184._10_2_ = -(ushort)(auVar133._10_2_ < auVar171._10_2_);
    auVar184._12_2_ = -(ushort)(auVar133._12_2_ < auVar171._12_2_);
    auVar184._14_2_ = -(ushort)(auVar133._14_2_ < auVar171._14_2_);
    auVar36._4_2_ = sVar167;
    auVar36._0_4_ = uVar131;
    auVar36._6_2_ = sVar168;
    auVar36._8_2_ = sVar167;
    auVar36._10_2_ = sVar168;
    auVar36._12_2_ = sVar167;
    auVar36._14_2_ = sVar168;
    auVar205._0_2_ = auVar114._0_2_ - sVar167;
    auVar205._2_2_ = (ushort)bVar115 - sVar168;
    auVar205._4_2_ = (ushort)bVar116 - sVar167;
    auVar205._6_2_ = (ushort)bVar117 - sVar168;
    auVar205._8_2_ = (ushort)bVar118 - sVar167;
    auVar205._10_2_ = (ushort)bVar119 - sVar168;
    auVar205._12_2_ = (ushort)bVar120 - sVar167;
    auVar205._14_2_ = (ushort)bVar121 - sVar168;
    auVar171 = pabsw(auVar205,auVar205);
    auVar155._0_2_ = (auVar145._0_2_ + auVar114._0_2_) - sVar167;
    auVar155._2_2_ = (auVar145._2_2_ + (ushort)bVar115) - sVar168;
    auVar155._4_2_ = (auVar145._4_2_ + (ushort)bVar116) - sVar167;
    auVar155._6_2_ = (auVar145._6_2_ + (ushort)bVar117) - sVar168;
    auVar155._8_2_ = (auVar145._8_2_ + (ushort)bVar118) - sVar167;
    auVar155._10_2_ = (auVar145._10_2_ + (ushort)bVar119) - sVar168;
    auVar155._12_2_ = (auVar145._12_2_ + (ushort)bVar120) - sVar167;
    auVar155._14_2_ = (auVar145._14_2_ + (ushort)bVar121) - sVar168;
    auVar133 = pabsw(auVar155,auVar155);
    auVar161._0_2_ = -(ushort)(sVar130 < auVar171._0_2_);
    auVar161._2_2_ = -(ushort)(sVar135 < auVar171._2_2_);
    auVar161._4_2_ = -(ushort)(sVar136 < auVar171._4_2_);
    auVar161._6_2_ = -(ushort)(sVar137 < auVar171._6_2_);
    auVar161._8_2_ = -(ushort)(sVar138 < auVar171._8_2_);
    auVar161._10_2_ = -(ushort)(sVar139 < auVar171._10_2_);
    auVar161._12_2_ = -(ushort)(sVar140 < auVar171._12_2_);
    auVar161._14_2_ = -(ushort)(sVar141 < auVar171._14_2_);
    auVar206._0_2_ = -(ushort)(auVar133._0_2_ < auVar171._0_2_);
    auVar206._2_2_ = -(ushort)(auVar133._2_2_ < auVar171._2_2_);
    auVar206._4_2_ = -(ushort)(auVar133._4_2_ < auVar171._4_2_);
    auVar206._6_2_ = -(ushort)(auVar133._6_2_ < auVar171._6_2_);
    auVar206._8_2_ = -(ushort)(auVar133._8_2_ < auVar171._8_2_);
    auVar206._10_2_ = -(ushort)(auVar133._10_2_ < auVar171._10_2_);
    auVar206._12_2_ = -(ushort)(auVar133._12_2_ < auVar171._12_2_);
    auVar206._14_2_ = -(ushort)(auVar133._14_2_ < auVar171._14_2_);
    auVar162._0_2_ = -(ushort)(auVar133._0_2_ < sVar130);
    auVar162._2_2_ = -(ushort)(auVar133._2_2_ < sVar135);
    auVar162._4_2_ = -(ushort)(auVar133._4_2_ < sVar136);
    auVar162._6_2_ = -(ushort)(auVar133._6_2_ < sVar137);
    auVar162._8_2_ = -(ushort)(auVar133._8_2_ < sVar138);
    auVar162._10_2_ = -(ushort)(auVar133._10_2_ < sVar139);
    auVar162._12_2_ = -(ushort)(auVar133._12_2_ < sVar140);
    auVar162._14_2_ = -(ushort)(auVar133._14_2_ < sVar141);
    auVar37._4_2_ = sVar167;
    auVar37._0_4_ = uVar131;
    auVar37._6_2_ = sVar168;
    auVar37._8_2_ = sVar167;
    auVar37._10_2_ = sVar168;
    auVar37._12_2_ = sVar167;
    auVar37._14_2_ = sVar168;
    auVar171 = ~(auVar176 | auVar204) & auVar194 |
               (~auVar184 & auVar159 | auVar36 & auVar184) & (auVar176 | auVar204);
    auVar151 = ~(auVar206 | auVar161) & auVar194 |
               (~auVar162 & auVar114 | auVar37 & auVar162) & (auVar206 | auVar161);
    sVar3 = auVar171._0_2_;
    sVar6 = auVar171._2_2_;
    auVar133[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar171[2] - (0xff < sVar6);
    auVar133[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0] - (0xff < sVar3);
    sVar3 = auVar171._4_2_;
    auVar133[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[4] - (0xff < sVar3);
    sVar3 = auVar171._6_2_;
    auVar133[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[6] - (0xff < sVar3);
    sVar3 = auVar171._8_2_;
    auVar133[4] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[8] - (0xff < sVar3);
    sVar3 = auVar171._10_2_;
    auVar133[5] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[10] - (0xff < sVar3);
    sVar3 = auVar171._12_2_;
    auVar133[6] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0xc] - (0xff < sVar3);
    sVar3 = auVar171._14_2_;
    auVar133[7] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0xe] - (0xff < sVar3);
    sVar3 = auVar151._0_2_;
    auVar133[8] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0] - (0xff < sVar3);
    sVar3 = auVar151._2_2_;
    auVar133[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[2] - (0xff < sVar3);
    sVar3 = auVar151._4_2_;
    auVar133[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[4] - (0xff < sVar3);
    sVar3 = auVar151._6_2_;
    auVar133[0xb] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[6] - (0xff < sVar3);
    sVar3 = auVar151._8_2_;
    auVar133[0xc] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[8] - (0xff < sVar3);
    sVar3 = auVar151._10_2_;
    auVar133[0xd] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[10] - (0xff < sVar3);
    sVar3 = auVar151._12_2_;
    auVar133[0xe] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0xc] - (0xff < sVar3);
    sVar3 = auVar151._14_2_;
    auVar133[0xf] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0xe] - (0xff < sVar3);
    auVar156._0_2_ = (auVar170._0_2_ + sVar193) - auVar169._0_2_;
    auVar156._2_2_ = (auVar170._2_2_ + sVar195) - auVar71._2_2_;
    auVar156._4_2_ = (auVar170._4_2_ + sVar196) - auVar83._0_2_;
    auVar156._6_2_ = (auVar170._6_2_ + sVar197) - sVar177;
    auVar156._8_2_ = (auVar170._8_2_ + sVar198) - auVar67._8_2_;
    auVar156._10_2_ = (auVar170._10_2_ + sVar199) - auVar59._10_2_;
    auVar156._12_2_ = (auVar170._12_2_ + sVar200) - auVar51._12_2_;
    auVar156._14_2_ = (auVar170._14_2_ + sVar201) - (uVar50 >> 8);
    auVar171 = pabsw(auVar156,auVar156);
    auVar163._0_2_ = (auVar170._0_2_ + sVar193) - sVar167;
    auVar163._2_2_ = (auVar170._2_2_ + sVar195) - sVar168;
    auVar163._4_2_ = (auVar170._4_2_ + sVar196) - sVar167;
    auVar163._6_2_ = (auVar170._6_2_ + sVar197) - sVar168;
    auVar163._8_2_ = (auVar170._8_2_ + sVar198) - sVar167;
    auVar163._10_2_ = (auVar170._10_2_ + sVar199) - sVar168;
    auVar163._12_2_ = (auVar170._12_2_ + sVar200) - sVar167;
    auVar163._14_2_ = (auVar170._14_2_ + sVar201) - sVar168;
    auVar151 = pabsw(auVar163,auVar163);
    local_e8 = auVar98._0_2_;
    sStack_e6 = auVar98._2_2_;
    sStack_e4 = auVar98._4_2_;
    sStack_e2 = auVar98._6_2_;
    sStack_e0 = auVar98._8_2_;
    sStack_de = auVar98._10_2_;
    sStack_dc = auVar98._12_2_;
    sStack_da = auVar98._14_2_;
    auVar207._0_2_ = -(ushort)(auVar171._0_2_ < local_e8);
    auVar207._2_2_ = -(ushort)(auVar171._2_2_ < sStack_e6);
    auVar207._4_2_ = -(ushort)(auVar171._4_2_ < sStack_e4);
    auVar207._6_2_ = -(ushort)(auVar171._6_2_ < sStack_e2);
    auVar207._8_2_ = -(ushort)(auVar171._8_2_ < sStack_e0);
    auVar207._10_2_ = -(ushort)(auVar171._10_2_ < sStack_de);
    auVar207._12_2_ = -(ushort)(auVar171._12_2_ < sStack_dc);
    auVar207._14_2_ = -(ushort)(auVar171._14_2_ < sStack_da);
    auVar185._0_2_ = -(ushort)(auVar151._0_2_ < local_e8);
    auVar185._2_2_ = -(ushort)(auVar151._2_2_ < sStack_e6);
    auVar185._4_2_ = -(ushort)(auVar151._4_2_ < sStack_e4);
    auVar185._6_2_ = -(ushort)(auVar151._6_2_ < sStack_e2);
    auVar185._8_2_ = -(ushort)(auVar151._8_2_ < sStack_e0);
    auVar185._10_2_ = -(ushort)(auVar151._10_2_ < sStack_de);
    auVar185._12_2_ = -(ushort)(auVar151._12_2_ < sStack_dc);
    auVar185._14_2_ = -(ushort)(auVar151._14_2_ < sStack_da);
    auVar157._0_2_ = -(ushort)(auVar151._0_2_ < auVar171._0_2_);
    auVar157._2_2_ = -(ushort)(auVar151._2_2_ < auVar171._2_2_);
    auVar157._4_2_ = -(ushort)(auVar151._4_2_ < auVar171._4_2_);
    auVar157._6_2_ = -(ushort)(auVar151._6_2_ < auVar171._6_2_);
    auVar157._8_2_ = -(ushort)(auVar151._8_2_ < auVar171._8_2_);
    auVar157._10_2_ = -(ushort)(auVar151._10_2_ < auVar171._10_2_);
    auVar157._12_2_ = -(ushort)(auVar151._12_2_ < auVar171._12_2_);
    auVar157._14_2_ = -(ushort)(auVar151._14_2_ < auVar171._14_2_);
    auVar38._4_2_ = sVar167;
    auVar38._0_4_ = uVar131;
    auVar38._6_2_ = sVar168;
    auVar38._8_2_ = sVar167;
    auVar38._10_2_ = sVar168;
    auVar38._12_2_ = sVar167;
    auVar38._14_2_ = sVar168;
    auVar164._0_2_ = auVar122._0_2_ - sVar167;
    auVar164._2_2_ = (ushort)bVar123 - sVar168;
    auVar164._4_2_ = (ushort)bVar124 - sVar167;
    auVar164._6_2_ = (ushort)bVar125 - sVar168;
    auVar164._8_2_ = (ushort)bVar126 - sVar167;
    auVar164._10_2_ = (ushort)bVar127 - sVar168;
    auVar164._12_2_ = (ushort)bVar128 - sVar167;
    auVar164._14_2_ = (ushort)bVar129 - sVar168;
    auVar151 = pabsw(auVar164,auVar164);
    auVar146._0_2_ = (auVar145._0_2_ + auVar122._0_2_) - sVar167;
    auVar146._2_2_ = (auVar145._2_2_ + (ushort)bVar123) - sVar168;
    auVar146._4_2_ = (auVar145._4_2_ + (ushort)bVar124) - sVar167;
    auVar146._6_2_ = (auVar145._6_2_ + (ushort)bVar125) - sVar168;
    auVar146._8_2_ = (auVar145._8_2_ + (ushort)bVar126) - sVar167;
    auVar146._10_2_ = (auVar145._10_2_ + (ushort)bVar127) - sVar168;
    auVar146._12_2_ = (auVar145._12_2_ + (ushort)bVar128) - sVar167;
    auVar146._14_2_ = (auVar145._14_2_ + (ushort)bVar129) - sVar168;
    auVar171 = pabsw(auVar146,auVar146);
    auVar208._0_2_ = -(ushort)(sVar130 < auVar151._0_2_);
    auVar208._2_2_ = -(ushort)(sVar135 < auVar151._2_2_);
    auVar208._4_2_ = -(ushort)(sVar136 < auVar151._4_2_);
    auVar208._6_2_ = -(ushort)(sVar137 < auVar151._6_2_);
    auVar208._8_2_ = -(ushort)(sVar138 < auVar151._8_2_);
    auVar208._10_2_ = -(ushort)(sVar139 < auVar151._10_2_);
    auVar208._12_2_ = -(ushort)(sVar140 < auVar151._12_2_);
    auVar208._14_2_ = -(ushort)(sVar141 < auVar151._14_2_);
    auVar165._0_2_ = -(ushort)(auVar171._0_2_ < auVar151._0_2_);
    auVar165._2_2_ = -(ushort)(auVar171._2_2_ < auVar151._2_2_);
    auVar165._4_2_ = -(ushort)(auVar171._4_2_ < auVar151._4_2_);
    auVar165._6_2_ = -(ushort)(auVar171._6_2_ < auVar151._6_2_);
    auVar165._8_2_ = -(ushort)(auVar171._8_2_ < auVar151._8_2_);
    auVar165._10_2_ = -(ushort)(auVar171._10_2_ < auVar151._10_2_);
    auVar165._12_2_ = -(ushort)(auVar171._12_2_ < auVar151._12_2_);
    auVar165._14_2_ = -(ushort)(auVar171._14_2_ < auVar151._14_2_);
    auVar134._0_2_ = -(ushort)(auVar171._0_2_ < sVar130);
    auVar134._2_2_ = -(ushort)(auVar171._2_2_ < sVar135);
    auVar134._4_2_ = -(ushort)(auVar171._4_2_ < sVar136);
    auVar134._6_2_ = -(ushort)(auVar171._6_2_ < sVar137);
    auVar134._8_2_ = -(ushort)(auVar171._8_2_ < sVar138);
    auVar134._10_2_ = -(ushort)(auVar171._10_2_ < sVar139);
    auVar134._12_2_ = -(ushort)(auVar171._12_2_ < sVar140);
    auVar134._14_2_ = -(ushort)(auVar171._14_2_ < sVar141);
    auVar39._4_2_ = sVar167;
    auVar39._0_4_ = uVar131;
    auVar39._6_2_ = sVar168;
    auVar39._8_2_ = sVar167;
    auVar39._10_2_ = sVar168;
    auVar39._12_2_ = sVar167;
    auVar39._14_2_ = sVar168;
    auVar151 = ~(auVar185 | auVar207) & auVar194 |
               (~auVar157 & auVar169 | auVar38 & auVar157) & (auVar185 | auVar207);
    auVar171 = ~(auVar165 | auVar208) & auVar194 |
               (~auVar134 & auVar122 | auVar39 & auVar134) & (auVar165 | auVar208);
    sVar3 = auVar151._0_2_;
    sVar6 = auVar151._2_2_;
    in_XMM10[1] = (0 < sVar6) * (sVar6 < 0x100) * auVar151[2] - (0xff < sVar6);
    in_XMM10[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0] - (0xff < sVar3);
    sVar3 = auVar151._4_2_;
    in_XMM10[2] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[4] - (0xff < sVar3);
    sVar3 = auVar151._6_2_;
    in_XMM10[3] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[6] - (0xff < sVar3);
    sVar3 = auVar151._8_2_;
    in_XMM10[4] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[8] - (0xff < sVar3);
    sVar3 = auVar151._10_2_;
    in_XMM10[5] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[10] - (0xff < sVar3);
    sVar3 = auVar151._12_2_;
    in_XMM10[6] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0xc] - (0xff < sVar3);
    sVar3 = auVar151._14_2_;
    in_XMM10[7] = (0 < sVar3) * (sVar3 < 0x100) * auVar151[0xe] - (0xff < sVar3);
    sVar3 = auVar171._0_2_;
    in_XMM10[8] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0] - (0xff < sVar3);
    sVar3 = auVar171._2_2_;
    in_XMM10[9] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[2] - (0xff < sVar3);
    sVar3 = auVar171._4_2_;
    in_XMM10[10] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[4] - (0xff < sVar3);
    sVar3 = auVar171._6_2_;
    in_XMM10[0xb] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[6] - (0xff < sVar3);
    sVar3 = auVar171._8_2_;
    in_XMM10[0xc] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[8] - (0xff < sVar3);
    sVar3 = auVar171._10_2_;
    in_XMM10[0xd] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[10] - (0xff < sVar3);
    sVar3 = auVar171._12_2_;
    in_XMM10[0xe] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0xc] - (0xff < sVar3);
    sVar3 = auVar171._14_2_;
    in_XMM10[0xf] = (0 < sVar3) * (sVar3 < 0x100) * auVar171[0xe] - (0xff < sVar3);
    pauVar93[-3][0] = (0 < sVar1) * (sVar1 < 0x100) * auVar187[0] - (0xff < sVar1);
    pauVar93[-3][1] = (0 < sVar4) * (sVar4 < 0x100) * auVar187[2] - (0xff < sVar4);
    pauVar93[-3][2] = (0 < sVar7) * (sVar7 < 0x100) * auVar187[4] - (0xff < sVar7);
    pauVar93[-3][3] = (0 < sVar9) * (sVar9 < 0x100) * auVar187[6] - (0xff < sVar9);
    pauVar93[-3][4] = (0 < sVar11) * (sVar11 < 0x100) * auVar187[8] - (0xff < sVar11);
    pauVar93[-3][5] = (0 < sVar13) * (sVar13 < 0x100) * auVar187[10] - (0xff < sVar13);
    pauVar93[-3][6] = (0 < sVar15) * (sVar15 < 0x100) * auVar187[0xc] - (0xff < sVar15);
    pauVar93[-3][7] = (0 < sVar17) * (sVar17 < 0x100) * auVar187[0xe] - (0xff < sVar17);
    pauVar93[-3][8] = (0 < sVar19) * (sVar19 < 0x100) * auVar180[0] - (0xff < sVar19);
    pauVar93[-3][9] = (0 < sVar21) * (sVar21 < 0x100) * auVar180[2] - (0xff < sVar21);
    pauVar93[-3][10] = (0 < sVar23) * (sVar23 < 0x100) * auVar180[4] - (0xff < sVar23);
    pauVar93[-3][0xb] = (0 < sVar25) * (sVar25 < 0x100) * auVar180[6] - (0xff < sVar25);
    pauVar93[-3][0xc] = (0 < sVar27) * (sVar27 < 0x100) * auVar180[8] - (0xff < sVar27);
    pauVar93[-3][0xd] = (0 < sVar29) * (sVar29 < 0x100) * auVar180[10] - (0xff < sVar29);
    pauVar93[-3][0xe] = (0 < sVar31) * (sVar31 < 0x100) * auVar180[0xc] - (0xff < sVar31);
    pauVar93[-3][0xf] = (0 < sVar33) * (sVar33 < 0x100) * auVar180[0xe] - (0xff < sVar33);
    pauVar93[-2][0] = (0 < sVar2) * (sVar2 < 0x100) * auVar192[0] - (0xff < sVar2);
    pauVar93[-2][1] = (0 < sVar5) * (sVar5 < 0x100) * auVar192[2] - (0xff < sVar5);
    pauVar93[-2][2] = (0 < sVar8) * (sVar8 < 0x100) * auVar192[4] - (0xff < sVar8);
    pauVar93[-2][3] = (0 < sVar10) * (sVar10 < 0x100) * auVar192[6] - (0xff < sVar10);
    pauVar93[-2][4] = (0 < sVar12) * (sVar12 < 0x100) * auVar192[8] - (0xff < sVar12);
    pauVar93[-2][5] = (0 < sVar14) * (sVar14 < 0x100) * auVar192[10] - (0xff < sVar14);
    pauVar93[-2][6] = (0 < sVar16) * (sVar16 < 0x100) * auVar192[0xc] - (0xff < sVar16);
    pauVar93[-2][7] = (0 < sVar18) * (sVar18 < 0x100) * auVar192[0xe] - (0xff < sVar18);
    pauVar93[-2][8] = (0 < sVar20) * (sVar20 < 0x100) * auVar178[0] - (0xff < sVar20);
    pauVar93[-2][9] = (0 < sVar22) * (sVar22 < 0x100) * auVar178[2] - (0xff < sVar22);
    pauVar93[-2][10] = (0 < sVar24) * (sVar24 < 0x100) * auVar178[4] - (0xff < sVar24);
    pauVar93[-2][0xb] = (0 < sVar26) * (sVar26 < 0x100) * auVar178[6] - (0xff < sVar26);
    pauVar93[-2][0xc] = (0 < sVar28) * (sVar28 < 0x100) * auVar178[8] - (0xff < sVar28);
    pauVar93[-2][0xd] = (0 < sVar30) * (sVar30 < 0x100) * auVar178[10] - (0xff < sVar30);
    pauVar93[-2][0xe] = (0 < sVar32) * (sVar32 < 0x100) * auVar178[0xc] - (0xff < sVar32);
    pauVar93[-2][0xf] = (0 < sVar34) * (sVar34 < 0x100) * auVar178[0xe] - (0xff < sVar34);
    pauVar93[-1] = auVar133;
    *pauVar93 = in_XMM10;
    auVar194._0_2_ = auVar188._0_2_ + 1;
    auVar194._2_2_ = auVar188._2_2_ + 1;
    auVar194._4_2_ = auVar188._4_2_ + 1;
    auVar194._6_2_ = auVar188._6_2_ + 1;
    auVar194._8_2_ = auVar188._8_2_ + 1;
    auVar194._10_2_ = auVar188._10_2_ + 1;
    auVar194._12_2_ = auVar188._12_2_ + 1;
    auVar194._14_2_ = auVar188._14_2_ + 1;
    pauVar93 = (undefined1 (*) [16])(*pauVar93 + stride);
    iVar92 = iVar92 + -1;
    auVar188 = auVar194;
  } while (iVar92 != 0);
  return;
}

Assistant:

void aom_paeth_predictor_64x16_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i;
  const __m128i l = _mm_load_si128((const __m128i *)left);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  for (i = 0; i < 16; ++i) {
    l16 = _mm_shuffle_epi8(l, rep);
    const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
    const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
    const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
    const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

    _mm_store_si128((__m128i *)dst, r0);
    _mm_store_si128((__m128i *)(dst + 16), r1);
    _mm_store_si128((__m128i *)(dst + 32), r2);
    _mm_store_si128((__m128i *)(dst + 48), r3);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}